

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

size_t bignParamsDec_internal(bign_params *params,octet *der,size_t count)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  octet *val;
  octet *poVar9;
  octet *der_00;
  octet *der_01;
  der_anchor_t *anchor;
  long in_RSI;
  undefined8 *in_RDI;
  size_t t_14;
  size_t t_13;
  size_t t_12;
  size_t t_11;
  size_t t_10;
  size_t t_9;
  size_t t_8;
  size_t t_7;
  size_t t_6;
  size_t t_5;
  size_t t_4;
  size_t t_3;
  size_t t_2;
  size_t t_1;
  size_t t;
  size_t len;
  octet *ptr;
  der_anchor_t CurveSeq [1];
  der_anchor_t FieldSeq [1];
  der_anchor_t ParamSeq [1];
  undefined7 in_stack_fffffffffffffee8;
  octet in_stack_fffffffffffffeef;
  void *in_stack_fffffffffffffef0;
  u32 tag;
  size_t in_stack_fffffffffffffef8;
  der_anchor_t *in_stack_ffffffffffffff00;
  der_anchor_t *in_stack_ffffffffffffff08;
  octet *in_stack_ffffffffffffff10;
  octet *in_stack_ffffffffffffff18;
  size_t *in_stack_ffffffffffffff20;
  octet *in_stack_ffffffffffffff28;
  octet *local_90;
  octet *local_8;
  
  memSet(in_stack_fffffffffffffef0,in_stack_fffffffffffffeef,0x1474ef);
  tag = (u32)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  sVar2 = derTSEQDecStart(in_stack_ffffffffffffff08,(octet *)in_stack_ffffffffffffff00,
                          in_stack_fffffffffffffef8,tag);
  if (sVar2 == 0xffffffffffffffff) {
    local_8 = (octet *)0xffffffffffffffff;
  }
  else {
    sVar3 = derTSIZEDec2((octet *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,tag,
                         CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    if (sVar3 == 0xffffffffffffffff) {
      local_8 = (octet *)0xffffffffffffffff;
    }
    else {
      sVar4 = derTSEQDecStart(in_stack_ffffffffffffff08,(octet *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8,tag);
      if (sVar4 == 0xffffffffffffffff) {
        local_8 = (octet *)0xffffffffffffffff;
      }
      else {
        sVar5 = derOIDDec2(in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                           (char *)in_stack_ffffffffffffff08);
        if (sVar5 == 0xffffffffffffffff) {
          local_8 = (octet *)0xffffffffffffffff;
        }
        else {
          sVar6 = derTUINTDec(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                              (u32)((ulong)in_stack_ffffffffffffff08 >> 0x20));
          if (sVar6 == 0xffffffffffffffff) {
            local_8 = (octet *)0xffffffffffffffff;
          }
          else {
            *in_RDI = 0x80;
            sVar6 = derTUINTDec(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                                (u32)((ulong)in_stack_ffffffffffffff08 >> 0x20));
            if (sVar6 == 0xffffffffffffffff) {
              local_8 = (octet *)0xffffffffffffffff;
            }
            else {
              sVar7 = derTSEQDecStop((octet *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
              if (sVar7 == 0xffffffffffffffff) {
                local_8 = (octet *)0xffffffffffffffff;
              }
              else {
                sVar8 = derTSEQDecStart(in_stack_ffffffffffffff08,(octet *)in_stack_ffffffffffffff00
                                        ,in_stack_fffffffffffffef8,tag);
                if (sVar8 == 0xffffffffffffffff) {
                  local_8 = (octet *)0xffffffffffffffff;
                }
                else {
                  val = (octet *)derTOCTDec2((octet *)in_stack_ffffffffffffff08,
                                             (octet *)in_stack_ffffffffffffff00,
                                             in_stack_fffffffffffffef8,tag,
                                             CONCAT17(in_stack_fffffffffffffeef,
                                                      in_stack_fffffffffffffee8));
                  if (val == (octet *)0xffffffffffffffff) {
                    local_8 = (octet *)0xffffffffffffffff;
                  }
                  else {
                    poVar9 = val + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + sVar3 + sVar2 + in_RSI;
                    der_00 = (octet *)derTOCTDec2((octet *)in_stack_ffffffffffffff08,
                                                  (octet *)in_stack_ffffffffffffff00,
                                                  in_stack_fffffffffffffef8,tag,
                                                  CONCAT17(in_stack_fffffffffffffeef,
                                                           in_stack_fffffffffffffee8));
                    if (der_00 == (octet *)0xffffffffffffffff) {
                      local_8 = (octet *)0xffffffffffffffff;
                    }
                    else {
                      poVar9 = der_00 + (long)poVar9;
                      sVar2 = derTBITDec2(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                          (size_t)in_stack_ffffffffffffff08,
                                          (u32)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                                          in_stack_fffffffffffffef8);
                      if (sVar2 == 0xffffffffffffffff) {
                        local_8 = (octet *)0xffffffffffffffff;
                      }
                      else {
                        sVar3 = sVar2;
                        sVar4 = derTSEQDecStop((octet *)in_stack_ffffffffffffff08,
                                               in_stack_ffffffffffffff00);
                        if (sVar4 == 0xffffffffffffffff) {
                          local_8 = (octet *)0xffffffffffffffff;
                        }
                        else {
                          lVar1 = sVar4 + sVar2;
                          der_01 = (octet *)derTOCTDec2((octet *)in_stack_ffffffffffffff08,
                                                        (octet *)in_stack_ffffffffffffff00,
                                                        in_stack_fffffffffffffef8,tag,
                                                        CONCAT17(in_stack_fffffffffffffeef,
                                                                 in_stack_fffffffffffffee8));
                          if (der_01 == (octet *)0xffffffffffffffff) {
                            local_8 = (octet *)0xffffffffffffffff;
                          }
                          else {
                            local_90 = der_01 + (long)(poVar9 + lVar1);
                            anchor = (der_anchor_t *)
                                     derTUINTDec2(val,der_00,sVar3,(u32)(sVar4 >> 0x20),
                                                  (size_t)der_01);
                            if (anchor == (der_anchor_t *)0xffffffffffffffff) {
                              local_8 = (octet *)0xffffffffffffffff;
                            }
                            else {
                              local_90 = local_90 + (long)&anchor->der;
                              sVar2 = derTSIZEDec2((octet *)anchor,in_stack_fffffffffffffef8,tag,
                                                   CONCAT17(in_stack_fffffffffffffeef,
                                                            in_stack_fffffffffffffee8));
                              if (sVar2 != 0xffffffffffffffff) {
                                local_90 = local_90 + sVar2;
                              }
                              sVar2 = derTSEQDecStop(der_01,anchor);
                              if (sVar2 == 0xffffffffffffffff) {
                                local_8 = (octet *)0xffffffffffffffff;
                              }
                              else {
                                local_8 = local_90 + (sVar2 - in_RSI);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t bignParamsDec_internal(bign_params* params, const octet der[],
	size_t count)
{
	der_anchor_t ParamSeq[1];
	der_anchor_t FieldSeq[1];
	der_anchor_t CurveSeq[1];
	const octet* ptr = der;
	size_t len = 32;
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	ASSERT(memIsValid(der, count));
	// начать декодирование...
	memSetZero(params, sizeof(bign_params));
	derDecStep(derSEQDecStart(ParamSeq, ptr, count), ptr, count);
	 // ...version...
	 derDecStep(derSIZEDec2(ptr, count, 1), ptr, count);
	 // ...FieldID...
	 derDecStep(derSEQDecStart(FieldSeq, ptr, count), ptr, count);
	  derDecStep(derOIDDec2(ptr, count, oid_bign_primefield), ptr, count);
	  if (derUINTDec(0, &len, ptr, count) == SIZE_MAX ||
		len != 32 && len != 48 && len != 64)
		return SIZE_MAX;
	  params->l = len * 4;
	  derDecStep(derUINTDec(params->p, &len, ptr, count), ptr, count);
	 derDecStep(derSEQDecStop(ptr, FieldSeq), ptr, count);
	 // ...Curve...
	 derDecStep(derSEQDecStart(CurveSeq, ptr, count), ptr, count);
	  derDecStep(derOCTDec2(params->a, ptr, count,  len), ptr, count);
	  derDecStep(derOCTDec2(params->b, ptr, count,  len), ptr, count);
	  derDecStep(derBITDec2(params->seed, ptr, count, 64), ptr, count);
	 derDecStep(derSEQDecStop(ptr, CurveSeq), ptr, count);
	 // ...base...
	 derDecStep(derOCTDec2(params->yG, ptr, count, len), ptr, count);
	 // ...order...
	 derDecStep(derUINTDec2(params->q, ptr, count, len), ptr, count);
	 // ...cofactor(optional)...
	 derDecStep2(derSIZEDec2(ptr, count, 1), ptr, count);
	 // ...завершить декодирование
	derDecStep(derSEQDecStop(ptr, ParamSeq), ptr, count);
	// возвратить точную длину DER-кода
	return ptr - der;
}